

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O1

char * test_vector3_rotate_by_quaternion_xy_half_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  char *pcVar3;
  vector3 r;
  quaternion q;
  vector3 vStack_48;
  quaternion local_30;
  
  pvVar2 = vector3_get_reference_vector3(2);
  quaternion_set_from_axis_anglev3(&local_30,pvVar2,3.1415927410125732);
  pvVar2 = vector3_get_reference_vector3(1);
  pvVar2 = vector3_set(&vStack_48,pvVar2);
  vector3_rotate_by_quaternion(pvVar2,&local_30);
  pvVar2 = vector3_get_reference_vector3(4);
  iVar1 = vector3_equals(&vStack_48,pvVar2);
  pcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(240) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(4))))"
    ;
  }
  return pcVar3;
}

Assistant:

static char *test_vector3_rotate_by_quaternion_xy_half_turn(void)
{
	struct quaternion q;
	struct vector3 r;

	quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_Y, HYP_TAU / 2.0f);
	vector3_rotate_by_quaternion(vector3_set(&r, HYP_VECTOR3_UNIT_X), &q);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_X_NEGATIVE));

	return NULL;
}